

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O1

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer *ppEVar1;
  iterator __position;
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  Entry entry;
  Entry local_20;
  
  local_20.pid = (int)__buf;
  local_20.size = CONCAT44(in_register_00000084,__flags);
  __position._M_current =
       (this->m_sends).
       super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_sends).
      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_20.addr = (char *)__n;
    local_20.tag = __fd;
    std::vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>>::
    _M_realloc_insert<bsplib::Unbuf::Entry_const&>
              ((vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>> *)&this->m_sends,
               __position,&local_20);
    in_RAX = extraout_RAX;
  }
  else {
    (__position._M_current)->size = local_20.size;
    *(ulong *)&(__position._M_current)->tag = CONCAT44(local_20._28_4_,__fd);
    *(ulong *)__position._M_current = CONCAT44(local_20._4_4_,local_20.pid);
    (__position._M_current)->addr = (char *)__n;
    ppEVar1 = &(this->m_sends).
               super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return in_RAX;
}

Assistant:

void Unbuf :: send( int recv_tag, int dst_pid, const void * addr, size_t size )
{
    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size, 
                    recv_tag };
    m_sends.push_back( entry );
}